

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void opengv::absolute_pose::modules::gp3p_main
               (Matrix3d *f,Matrix3d *v,Matrix3d *p,transformations_t *solutions)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  iterator __position;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  undefined1 *puVar16;
  undefined1 auVar17 [16];
  double dVar18;
  Packet2d mask;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  rotation_t rotation;
  transformation_t transformation;
  Vector3d n;
  cayley_t cayley;
  Matrix<std::complex<double>,_8,_1,_0,_8,_1> D;
  Matrix<std::complex<double>,_8,_8,_0,_8,_8> V;
  Matrix<double,_8,_8,_0,_8,_8> M;
  EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> Eig;
  Matrix<double,_48,_85,_0,_48,_85> groebnerMatrix;
  undefined1 *local_93d0;
  long local_93c8;
  double local_93c0 [4];
  undefined8 uStack_93a0;
  double local_9398;
  double local_9390;
  double dStack_9388;
  double local_9380;
  Matrix3d *local_9370;
  vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
  *local_9368;
  undefined1 local_9360 [80];
  double dStack_9310;
  double local_9308;
  undefined8 local_9300;
  double adStack_92f8 [4];
  cayley_t local_92d8;
  undefined1 local_92c0 [128];
  EigenvectorsType local_9240;
  ulong local_8e40;
  ulong uStack_8e38;
  ulong uStack_8e30;
  ulong uStack_8e28;
  ulong uStack_8e20;
  ulong uStack_8e18;
  undefined8 uStack_8e10;
  undefined8 uStack_8e08;
  ulong local_8e00;
  ulong uStack_8df8;
  ulong uStack_8df0;
  ulong uStack_8de8;
  ulong uStack_8de0;
  ulong uStack_8dd8;
  undefined8 uStack_8dd0;
  undefined8 uStack_8dc8;
  ulong local_8dc0;
  ulong uStack_8db8;
  ulong uStack_8db0;
  ulong uStack_8da8;
  ulong uStack_8da0;
  ulong uStack_8d98;
  undefined8 uStack_8d90;
  undefined8 uStack_8d88;
  ulong local_8d80;
  ulong uStack_8d78;
  ulong uStack_8d70;
  ulong uStack_8d68;
  ulong uStack_8d60;
  ulong uStack_8d58;
  undefined8 uStack_8d50;
  undefined8 uStack_8d48;
  ulong local_8d40;
  ulong uStack_8d38;
  ulong uStack_8d30;
  ulong uStack_8d28;
  ulong uStack_8d20;
  ulong uStack_8d18;
  undefined8 uStack_8d10;
  undefined8 uStack_8d08;
  ulong local_8d00;
  ulong uStack_8cf8;
  ulong uStack_8cf0;
  ulong uStack_8ce8;
  ulong uStack_8ce0;
  ulong uStack_8cd8;
  undefined8 uStack_8cd0;
  undefined8 uStack_8cc8;
  ulong local_8cc0;
  ulong uStack_8cb8;
  ulong uStack_8cb0;
  ulong uStack_8ca8;
  ulong uStack_8ca0;
  ulong uStack_8c98;
  undefined8 uStack_8c90;
  undefined8 uStack_8c88;
  ulong local_8c80;
  ulong uStack_8c78;
  ulong uStack_8c70;
  ulong uStack_8c68;
  ulong uStack_8c60;
  ulong uStack_8c58;
  undefined8 uStack_8c50;
  undefined8 uStack_8c48;
  EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> local_8c40;
  EVP_PKEY_CTX local_8000 [29856];
  ulong local_b60;
  ulong uStack_b58;
  ulong local_b50;
  ulong uStack_b48;
  ulong local_b40;
  ulong uStack_b38;
  ulong local_9e0;
  ulong uStack_9d8;
  ulong local_9d0;
  ulong uStack_9c8;
  ulong local_9c0;
  ulong uStack_9b8;
  ulong local_860;
  ulong uStack_858;
  ulong local_850;
  ulong uStack_848;
  ulong local_840;
  ulong uStack_838;
  ulong local_6e0;
  ulong uStack_6d8;
  ulong local_6d0;
  ulong uStack_6c8;
  ulong local_6c0;
  ulong uStack_6b8;
  ulong local_560;
  ulong uStack_558;
  ulong local_550;
  ulong uStack_548;
  ulong local_540;
  ulong uStack_538;
  ulong local_3e0;
  ulong uStack_3d8;
  ulong local_3d0;
  ulong uStack_3c8;
  ulong local_3c0;
  ulong uStack_3b8;
  ulong local_260;
  ulong uStack_258;
  ulong local_250;
  ulong uStack_248;
  ulong local_240;
  ulong uStack_238;
  ulong local_e0;
  ulong uStack_d8;
  ulong local_d0;
  ulong uStack_c8;
  ulong local_c0;
  ulong uStack_b8;
  
  memset(local_8000,0,0x7f80);
  gp3p::init(local_8000);
  gp3p::compute((Matrix<double,_48,_85,_0,_48,_85> *)local_8000);
  local_8e40 = local_b60 ^ 0x8000000000000000;
  uStack_8e38 = uStack_b58 ^ 0x8000000000000000;
  uStack_8e30 = local_b50 ^ 0x8000000000000000;
  uStack_8e28 = uStack_b48 ^ 0x8000000000000000;
  uStack_8e20 = local_b40 ^ 0x8000000000000000;
  uStack_8e18 = uStack_b38 ^ 0x8000000000000000;
  uStack_8e08 = 0;
  uStack_8dd0 = 0;
  uStack_8dc8 = 0;
  uStack_8c50 = 0;
  uStack_8c48 = 0;
  uStack_8c90 = 0;
  uStack_8cd0 = 0;
  uStack_8cc8 = 0;
  uStack_8d10 = 0;
  uStack_8d08 = 0;
  uStack_8d50 = 0;
  uStack_8d48 = 0;
  uStack_8d90 = 0;
  uStack_8d88 = 0;
  local_8e00 = local_9e0 ^ 0x8000000000000000;
  uStack_8df8 = uStack_9d8 ^ 0x8000000000000000;
  uStack_8df0 = local_9d0 ^ 0x8000000000000000;
  uStack_8de8 = uStack_9c8 ^ 0x8000000000000000;
  uStack_8de0 = local_9c0 ^ 0x8000000000000000;
  uStack_8dd8 = uStack_9b8 ^ 0x8000000000000000;
  local_8dc0 = local_860 ^ 0x8000000000000000;
  uStack_8db8 = uStack_858 ^ 0x8000000000000000;
  uStack_8db0 = local_850 ^ 0x8000000000000000;
  uStack_8da8 = uStack_848 ^ 0x8000000000000000;
  uStack_8da0 = local_840 ^ 0x8000000000000000;
  uStack_8d98 = uStack_838 ^ 0x8000000000000000;
  local_8d80 = local_6e0 ^ 0x8000000000000000;
  uStack_8d78 = uStack_6d8 ^ 0x8000000000000000;
  uStack_8d70 = local_6d0 ^ 0x8000000000000000;
  uStack_8d68 = uStack_6c8 ^ 0x8000000000000000;
  uStack_8d60 = local_6c0 ^ 0x8000000000000000;
  uStack_8d58 = uStack_6b8 ^ 0x8000000000000000;
  local_8d40 = local_560 ^ 0x8000000000000000;
  uStack_8d38 = uStack_558 ^ 0x8000000000000000;
  uStack_8d30 = local_550 ^ 0x8000000000000000;
  uStack_8d28 = uStack_548 ^ 0x8000000000000000;
  uStack_8d20 = local_540 ^ 0x8000000000000000;
  uStack_8d18 = uStack_538 ^ 0x8000000000000000;
  local_8d00 = local_3e0 ^ 0x8000000000000000;
  uStack_8cf8 = uStack_3d8 ^ 0x8000000000000000;
  uStack_8cf0 = local_3d0 ^ 0x8000000000000000;
  uStack_8ce8 = uStack_3c8 ^ 0x8000000000000000;
  uStack_8ce0 = local_3c0 ^ 0x8000000000000000;
  uStack_8cd8 = uStack_3b8 ^ 0x8000000000000000;
  local_8cc0 = local_260 ^ 0x8000000000000000;
  uStack_8cb8 = uStack_258 ^ 0x8000000000000000;
  uStack_8cb0 = local_250 ^ 0x8000000000000000;
  uStack_8ca8 = uStack_248 ^ 0x8000000000000000;
  uStack_8ca0 = local_240 ^ 0x8000000000000000;
  uStack_8c98 = uStack_238 ^ 0x8000000000000000;
  local_8c80 = local_e0 ^ 0x8000000000000000;
  uStack_8c78 = uStack_d8 ^ 0x8000000000000000;
  uStack_8c70 = local_d0 ^ 0x8000000000000000;
  uStack_8c68 = uStack_c8 ^ 0x8000000000000000;
  uStack_8c60 = local_c0 ^ 0x8000000000000000;
  uStack_8c58 = uStack_b8 ^ 0x8000000000000000;
  local_8c40.m_realSchur.m_hess.m_isInitialized = false;
  uStack_8e10 = 0x3ff0000000000000;
  uStack_8c88 = 0x3ff0000000000000;
  local_8c40.m_realSchur.m_isInitialized = false;
  local_8c40.m_realSchur.m_matUisUptodate = false;
  local_8c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[0]._M_value._0_8_ = 0;
  local_8c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[0]._M_value._8_8_ = 0;
  local_8c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[1]._M_value._0_8_ = 0;
  local_8c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[1]._M_value._8_8_ = 0;
  local_8c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[2]._M_value._0_8_ = 0;
  local_8c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[2]._M_value._8_8_ = 0;
  local_8c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[3]._M_value._0_8_ = 0;
  local_8c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[3]._M_value._8_8_ = 0;
  local_8c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[4]._M_value._0_8_ = 0;
  local_8c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[4]._M_value._8_8_ = 0;
  local_8c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[5]._M_value._0_8_ = 0;
  local_8c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[5]._M_value._8_8_ = 0;
  local_8c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[6]._M_value._0_8_ = 0;
  local_8c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[6]._M_value._8_8_ = 0;
  local_8c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[7]._M_value._0_8_ = 0;
  local_8c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[7]._M_value._8_8_ = 0;
  local_8c40.m_isInitialized = false;
  local_8c40.m_eigenvectorsOk = false;
  local_8c40.m_realSchur.m_maxIters = -1;
  Eigen::EigenSolver<Eigen::Matrix<double,8,8,0,8,8>>::compute<Eigen::Matrix<double,8,8,0,8,8>>
            ((EigenSolver<Eigen::Matrix<double,8,8,0,8,8>> *)&local_8c40,
             (EigenBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> *)&local_8e40,true);
  local_92c0._8_8_ =
       local_8c40.m_eivalues.
       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[0]._M_value._8_8_;
  local_92c0._0_8_ =
       local_8c40.m_eivalues.
       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[0]._M_value._0_8_;
  local_92c0._16_8_ =
       local_8c40.m_eivalues.
       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[1]._M_value._0_8_;
  local_92c0._24_8_ =
       local_8c40.m_eivalues.
       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[1]._M_value._8_8_;
  local_92c0._32_8_ =
       local_8c40.m_eivalues.
       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[2]._M_value._0_8_;
  local_92c0._40_8_ =
       local_8c40.m_eivalues.
       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[2]._M_value._8_8_;
  local_92c0._48_8_ =
       local_8c40.m_eivalues.
       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[3]._M_value._0_8_;
  local_92c0._56_8_ =
       local_8c40.m_eivalues.
       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[3]._M_value._8_8_;
  local_92c0._64_8_ =
       local_8c40.m_eivalues.
       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[4]._M_value._0_8_;
  local_92c0._72_8_ =
       local_8c40.m_eivalues.
       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[4]._M_value._8_8_;
  local_92c0._80_8_ =
       local_8c40.m_eivalues.
       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[5]._M_value._0_8_;
  local_92c0._88_8_ =
       local_8c40.m_eivalues.
       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[5]._M_value._8_8_;
  local_92c0._96_8_ =
       local_8c40.m_eivalues.
       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[6]._M_value._0_8_;
  local_92c0._104_8_ =
       local_8c40.m_eivalues.
       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[6]._M_value._8_8_;
  local_92c0._112_8_ =
       local_8c40.m_eivalues.
       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[7]._M_value._0_8_;
  local_92c0._120_8_ =
       local_8c40.m_eivalues.
       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[7]._M_value._8_8_;
  Eigen::EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>::eigenvectors(&local_9240,&local_8c40);
  local_93d0 = (undefined1 *)
               ((long)(local_9240.
                       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>_>.
                       m_storage.m_data.array + 4) + 8);
  lVar13 = 0;
  local_9368 = (vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
                *)solutions;
  local_9370 = p;
  local_9300 = 0x4008000000000000;
  adStack_92f8[0] = 3.0;
  do {
    local_93c8 = lVar13;
    if (*(double *)(local_92c0 + lVar13 * 0x10 + 8) < 0.0001) {
      lVar15 = 3;
      puVar16 = local_93d0;
      do {
        dVar18 = (double)__divdc3();
        local_92d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[lVar15 + -1] = dVar18;
        dVar18 = (double)__divdc3(*(undefined8 *)(puVar16 + -0x38),*(undefined8 *)(puVar16 + -0x30),
                                  *(undefined8 *)
                                   (local_9240.
                                    super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>_>
                                    .m_storage.m_data.array + lVar13 * 8U + 7));
        adStack_92f8[lVar15] = dVar18;
        puVar16 = puVar16 + 0x10;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
      math::cayley2rot(&local_92d8);
      dVar12 = dStack_9388;
      dVar11 = local_9390;
      dVar10 = local_9398;
      dVar9 = local_93c0[3];
      dVar8 = local_93c0[2];
      dVar3 = local_93c0[1];
      dVar19 = 0.0;
      auVar21 = ZEXT864(0) << 0x40;
      lVar13 = 2;
      pdVar14 = adStack_92f8;
      auVar23 = ZEXT864(0) << 0x40;
      dVar18 = 0.0;
      local_93c0[3] = local_93c0[1];
      local_93c0[1] = dVar9;
      local_9390 = local_93c0[2];
      local_93c0[2] = dVar11;
      dStack_9388 = local_9398;
      local_9398 = dVar12;
      auVar4._8_8_ = uStack_93a0;
      auVar4._0_8_ = dVar3;
      auVar5._8_8_ = dVar10;
      auVar5._0_8_ = dVar8;
      do {
        pdVar14 = pdVar14 + 1;
        dVar3 = *pdVar14;
        pdVar1 = (f->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                 array + lVar13 + -2;
        pdVar2 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                 array + lVar13 + -2;
        local_9360._0_8_ = dVar3 * *pdVar1 + *pdVar2;
        local_9360._8_8_ = dVar3 * pdVar1[1] + pdVar2[1];
        auVar24._0_8_ = (double)local_9360._0_8_ * local_93c0[0];
        auVar24._8_8_ = (double)local_9360._0_8_ * dVar9;
        local_9360._16_8_ =
             dVar3 * (f->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[lVar13] +
             (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[lVar13];
        local_9360._24_8_ = local_93c0;
        auVar17._8_8_ = local_9360._8_8_;
        auVar17._0_8_ = local_9360._8_8_;
        auVar17 = vfmadd231pd_avx512vl(auVar24,auVar4,auVar17);
        pdVar1 = (local_9370->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                 m_storage.m_data.array + lVar13 + -2;
        auVar22._0_8_ = auVar23._0_8_ + *pdVar1;
        auVar22._8_8_ = auVar23._8_8_ + pdVar1[1];
        auVar23 = ZEXT1664(auVar22);
        dVar18 = dVar18 + (local_9370->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                          .m_storage.m_data.array[lVar13];
        lVar13 = lVar13 + 3;
        auVar6._8_8_ = local_9360._16_8_;
        auVar6._0_8_ = local_9360._16_8_;
        auVar17 = vfmadd231pd_avx512vl(auVar17,auVar5,auVar6);
        auVar20._0_8_ = auVar17._0_8_ + auVar21._0_8_;
        auVar20._8_8_ = auVar17._8_8_ + auVar21._8_8_;
        auVar21 = ZEXT1664(auVar20);
        dVar19 = (double)local_9360._0_8_ * dVar11 +
                 dVar12 * (double)local_9360._8_8_ + (double)local_9360._16_8_ * local_9380 + dVar19
        ;
      } while (lVar13 != 0xb);
      auVar7._8_8_ = adStack_92f8[0];
      auVar7._0_8_ = local_9300;
      lVar13 = 0x10;
      auVar4 = vdivpd_avx(auVar20,auVar7);
      auVar5 = vdivpd_avx(auVar22,auVar7);
      auVar4 = vsubpd_avx(auVar5,auVar4);
      do {
        *(undefined8 *)((long)&local_9370 + lVar13) = *(undefined8 *)((long)&local_93d0 + lVar13);
        *(undefined8 *)((long)&local_9368 + lVar13) = *(undefined8 *)((long)&local_93c8 + lVar13);
        *(undefined8 *)(local_9360 + lVar13) = *(undefined8 *)((long)local_93c0 + lVar13);
        lVar13 = lVar13 + 0x18;
      } while (lVar13 != 0x58);
      local_9308 = dVar18 / 3.0 - dVar19 / 3.0;
      stack0xffffffffffff6ce8 = auVar4;
      auVar4 = stack0xffffffffffff6ce8;
      __position._M_current = *(Matrix<double,_3,_4,_0,_3,_4> **)(local_9368 + 8);
      if (__position._M_current == *(Matrix<double,_3,_4,_0,_3,_4> **)(local_9368 + 0x10)) {
        std::
        vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,4,0,3,4>const&>
                  (local_9368,__position,(Matrix<double,_3,_4,_0,_3,_4> *)local_9360);
      }
      else {
        auVar21._8_8_ = local_9360._8_8_;
        auVar21._0_8_ = local_9360._0_8_;
        auVar21._16_8_ = local_9360._16_8_;
        auVar21._24_8_ = local_9360._24_8_;
        auVar21._32_8_ = local_9360._32_8_;
        auVar21._40_8_ = local_9360._40_8_;
        auVar21._48_8_ = local_9360._48_8_;
        auVar21._56_8_ = local_9360._56_8_;
        local_9360._72_8_ = auVar4._0_8_;
        dStack_9310 = auVar4._8_8_;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[4] = (double)local_9360._32_8_;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[5] = (double)local_9360._40_8_;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[6] = (double)local_9360._48_8_;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[7] = (double)local_9360._56_8_;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[8] = (double)local_9360._64_8_;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[9] = (double)local_9360._72_8_;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[10] = dStack_9310;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[0xb] = local_9308;
        *(undefined1 (*) [64])
         ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
         m_storage.m_data.array = auVar21;
        *(long *)(local_9368 + 8) = *(long *)(local_9368 + 8) + 0x60;
        unique0x1000179b = auVar4;
      }
    }
    lVar13 = local_93c8 + 1;
    local_93d0 = local_93d0 + 0x80;
  } while (lVar13 != 8);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gp3p_main(
    const Eigen::Matrix3d & f,
    const Eigen::Matrix3d & v,
    const Eigen::Matrix3d & p,
    transformations_t & solutions)
{
  Eigen::Matrix<double,48,85> groebnerMatrix =
      Eigen::Matrix<double,48,85>::Zero();
  gp3p::init(groebnerMatrix,f,v,p);
  gp3p::compute(groebnerMatrix);

  Eigen::Matrix<double,8,8> M = Eigen::Matrix<double,8,8>::Zero();
  M.block<6,8>(0,0) = -groebnerMatrix.block<6,8>(36,77);
  M(6,0) = 1.0;
  M(7,6) = 1.0;

  Eigen::EigenSolver< Eigen::Matrix<double,8,8> > Eig(M,true);
  Eigen::Matrix<std::complex<double>,8,1> D = Eig.eigenvalues();
  Eigen::Matrix<std::complex<double>,8,8> V = Eig.eigenvectors();

  for( int c = 0; c < V.cols(); c++ )
  {
    std::complex<double> eigValue = D[c];

    if( eigValue.imag() < 0.0001 )
    {
      cayley_t cayley;
      Eigen::Vector3d n;

      for(size_t i = 0; i < 3; i++)
      {
        std::complex<double> cay = V(i+4,c)/V(7,c);
        cayley[2-i] = cay.real();
        std::complex<double> depth = V(i+1,c)/V(7,c);
        n[2-i] = depth.real();
      }

      rotation_t rotation = math::cayley2rot(cayley);
      //the groebner problem was set up to find the transpose!
      rotation.transposeInPlace();

      point_t center_cam = Eigen::Vector3d::Zero();
      point_t center_world = Eigen::Vector3d::Zero();
      for( size_t i = 0; i < (size_t) f.cols(); i++ )
      {
        point_t temp = rotation*(n[i]*f.col(i)+v.col(i));
        center_cam = center_cam + temp;
        center_world = center_world + p.col(i);
      }

      center_cam = center_cam/f.cols();
      center_world = center_world/f.cols();
      translation_t translation = center_world - center_cam;

      transformation_t transformation;
      transformation.block<3,3>(0,0) = rotation;
      transformation.col(3) = translation;
      solutions.push_back(transformation);
    }
  }
}